

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
format_uint<1u,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned__int128>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned___int128 value,
          int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  type tVar1;
  char *buffer_00;
  int in_ECX;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  char local_f8 [8];
  char buffer [129];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_local;
  
  tVar1 = to_unsigned<int>(in_ECX);
  buffer_00 = to_pointer<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (out,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    value_01._8_8_ = in_stack_fffffffffffffef0;
    value_01._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>(local_f8,(unsigned___int128)value_01,num_digits,upper);
    out_local = copy_str<char,_char_*,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_0>
                          (local_f8,local_f8 + in_ECX,out);
  }
  else {
    value_00._8_8_ = in_stack_fffffffffffffef0;
    value_00._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>(buffer_00,(unsigned___int128)value_00,num_digits,upper);
    out_local.container = out.container;
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_local.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}